

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcode.cpp
# Opt level: O0

void selfCheckMapcodeToLatLon(char *mapcode,double lat,double lon)

{
  MapcodeError MVar1;
  double local_58;
  double local_50;
  double local_48;
  double deltaLon;
  double deltaLat;
  int err;
  Territory foundContext;
  double foundLon;
  double foundLat;
  double lon_local;
  double lat_local;
  char *mapcode_local;
  
  foundLat = lon;
  lon_local = lat;
  lat_local = (double)mapcode;
  MVar1 = decodeMapcodeToLatLonUtf8
                    (&foundLon,(double *)&err,mapcode,TERRITORY_NONE,(MapcodeElements *)0x0);
  if (MVar1 == ERR_OK) {
    if (foundLon - lon_local < 0.0) {
      local_50 = -(foundLon - lon_local);
    }
    else {
      local_50 = foundLon - lon_local;
    }
    if (_err - foundLat <= -0.0) {
      local_58 = -(_err - foundLat);
    }
    else {
      local_58 = _err - foundLat;
    }
    local_48 = local_58;
    if (180.0 < local_58) {
      local_48 = 360.0 - local_58;
    }
    if (((0.001 < local_50) || (0.001 < local_48)) &&
       (fprintf(_stderr,
                "error: decoding mapcode to lat/lon failure; lat=%.20g, lon=%.20g produces mapcode %s, which decodes to lat=%.20g (delta=%.20g), lon=%.20g (delta=%.20g)\n"
                ,lon_local,foundLat,foundLon,local_50,_err,local_48,lat_local),
       selfCheckEnabled != 0)) {
      exit(2);
    }
  }
  else {
    fprintf(_stderr,"error: decoding mapcode to lat/lon failure; cannot decode \'%s\')\n",lat_local)
    ;
    if (selfCheckEnabled != 0) {
      exit(2);
    }
  }
  return;
}

Assistant:

static void selfCheckMapcodeToLatLon(const char *mapcode,
                                     const double lat, const double lon) {
    double foundLat;
    double foundLon;
    // TODO: Fix self-check.
    // int foundContext = getTerritoryCode(territory, TERRITORY_NONE);
    enum Territory foundContext = TERRITORY_NONE;
    int err = decodeMapcodeToLatLonUtf8(&foundLat, &foundLon, mapcode, foundContext, NULL);
    if (err != 0) {
        fprintf(stderr, "error: decoding mapcode to lat/lon failure; "
                "cannot decode '%s')\n", mapcode);
        if (selfCheckEnabled) {
            exit(INTERNAL_ERROR);
        }
        return;
    }
    double deltaLat = ((foundLat - lat) >= 0.0 ? (foundLat - lat) : -(foundLat - lat));
    double deltaLon = ((foundLon - lon) > -0.0 ? (foundLon - lon) : -(foundLon - lon));
    if (deltaLon > 180.0) {
        deltaLon = 360.0 - deltaLon;
    }
    if ((deltaLat > DELTA) || (deltaLon > DELTA)) {
        fprintf(stderr, "error: decoding mapcode to lat/lon failure; "
                        "lat=%.20g, lon=%.20g produces mapcode %s, "
                        "which decodes to lat=%.20g (delta=%.20g), lon=%.20g (delta=%.20g)\n",
                lat, lon, mapcode, foundLat, deltaLat, foundLon, deltaLon);
        if (selfCheckEnabled) {
            exit(INTERNAL_ERROR);
        }
        return;
    }
}